

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void capnp::_::(anonymous_namespace)::
     expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
               (Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
                *promise,WaitScope *waitScope)

{
  SourceLocation location;
  WaitScope *__stat_loc;
  bool bVar1;
  __pid_t _Var2;
  bool local_7d;
  bool _kj_shouldLog;
  SourceLocation local_68;
  SourceLocation local_48;
  Type local_29;
  Promise<bool> local_28;
  bool local_1a;
  DebugExpression<bool> local_19;
  WaitScope *pWStack_18;
  DebugExpression<bool> _kjCondition;
  WaitScope *waitScope_local;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  *promise_local;
  
  pWStack_18 = waitScope;
  kj::SourceLocation::SourceLocation(&local_48);
  location.function = local_48.function;
  location.fileName = local_48.fileName;
  location.lineNumber = local_48.lineNumber;
  location.columnNumber = local_48.columnNumber;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>::
  then<capnp::_::(anonymous_namespace)::expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>(kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>&&,kj::WaitScope&)::_lambda(capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>&&)_1_,capnp::_::(anonymous_namespace)::expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>(kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>&&,kj::WaitScope&)::_lambda(kj::Exception&&)_1_>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
              *)&local_28,(Type *)promise,&local_29,location);
  __stat_loc = pWStack_18;
  kj::SourceLocation::SourceLocation
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,"expectPromiseThrows",0x550,0x17);
  _Var2 = kj::Promise<bool>::wait(&local_28,__stat_loc);
  local_1a = (bool)((byte)_Var2 & 1);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  kj::Promise<bool>::~Promise(&local_28);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar1) {
    local_7d = kj::_::Debug::shouldLog(ERROR);
    while (local_7d != false) {
      kj::_::Debug::log<char_const(&)[112],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x550,ERROR,
                 "\"failed: expected \" \"promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)\", _kjCondition"
                 ,(char (*) [112])
                  "failed: expected promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)"
                 ,&local_19);
      local_7d = false;
    }
  }
  return;
}

Assistant:

void expectPromiseThrows(kj::Promise<T>&& promise, kj::WaitScope& waitScope) {
  KJ_EXPECT(promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; })
      .wait(waitScope));
}